

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018c640 = 0x2d2d2d2d2d2d2d;
    uRam000000000018c647._0_1_ = '-';
    uRam000000000018c647._1_1_ = '-';
    uRam000000000018c647._2_1_ = '-';
    uRam000000000018c647._3_1_ = '-';
    uRam000000000018c647._4_1_ = '-';
    uRam000000000018c647._5_1_ = '-';
    uRam000000000018c647._6_1_ = '-';
    uRam000000000018c647._7_1_ = '-';
    DAT_0018c630 = '-';
    DAT_0018c630_1._0_1_ = '-';
    DAT_0018c630_1._1_1_ = '-';
    DAT_0018c630_1._2_1_ = '-';
    DAT_0018c630_1._3_1_ = '-';
    DAT_0018c630_1._4_1_ = '-';
    DAT_0018c630_1._5_1_ = '-';
    DAT_0018c630_1._6_1_ = '-';
    uRam000000000018c638 = 0x2d2d2d2d2d2d2d;
    DAT_0018c63f = 0x2d;
    DAT_0018c620 = '-';
    DAT_0018c620_1._0_1_ = '-';
    DAT_0018c620_1._1_1_ = '-';
    DAT_0018c620_1._2_1_ = '-';
    DAT_0018c620_1._3_1_ = '-';
    DAT_0018c620_1._4_1_ = '-';
    DAT_0018c620_1._5_1_ = '-';
    DAT_0018c620_1._6_1_ = '-';
    uRam000000000018c628._0_1_ = '-';
    uRam000000000018c628._1_1_ = '-';
    uRam000000000018c628._2_1_ = '-';
    uRam000000000018c628._3_1_ = '-';
    uRam000000000018c628._4_1_ = '-';
    uRam000000000018c628._5_1_ = '-';
    uRam000000000018c628._6_1_ = '-';
    uRam000000000018c628._7_1_ = '-';
    DAT_0018c610 = '-';
    DAT_0018c610_1._0_1_ = '-';
    DAT_0018c610_1._1_1_ = '-';
    DAT_0018c610_1._2_1_ = '-';
    DAT_0018c610_1._3_1_ = '-';
    DAT_0018c610_1._4_1_ = '-';
    DAT_0018c610_1._5_1_ = '-';
    DAT_0018c610_1._6_1_ = '-';
    uRam000000000018c618._0_1_ = '-';
    uRam000000000018c618._1_1_ = '-';
    uRam000000000018c618._2_1_ = '-';
    uRam000000000018c618._3_1_ = '-';
    uRam000000000018c618._4_1_ = '-';
    uRam000000000018c618._5_1_ = '-';
    uRam000000000018c618._6_1_ = '-';
    uRam000000000018c618._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018c608._0_1_ = '-';
    uRam000000000018c608._1_1_ = '-';
    uRam000000000018c608._2_1_ = '-';
    uRam000000000018c608._3_1_ = '-';
    uRam000000000018c608._4_1_ = '-';
    uRam000000000018c608._5_1_ = '-';
    uRam000000000018c608._6_1_ = '-';
    uRam000000000018c608._7_1_ = '-';
    DAT_0018c64f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }